

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

void Executor::statement(treeNode *node)

{
  size_t in_RDX;
  treeNode *in_RSI;
  
  switch((node->kind).stmtKind) {
  case ifStmt:
    ifStmt((Executor *)node,in_RSI);
    return;
  case doRpt:
    doStmt(node);
    return;
  case whileRpt:
    whileStmt((Executor *)node,in_RSI);
    return;
  default:
    return;
  case assignStmt:
    assignStmt(node);
    return;
  case declareStmt:
    declareStmt(node);
    return;
  case continueStmt:
    _continue();
    return;
  case readStmt:
    read((int)node,in_RSI,in_RDX);
    return;
  case printStmt:
    print(node);
    return;
  case breakStmt:
    _break();
    return;
  }
}

Assistant:

void statement(treeNode* node)
    {
        switch(node->kind.stmtKind)
        {
            case StmtKind::ifStmt:ifStmt(node);break;
            case StmtKind::printStmt:print(node);break;
            case StmtKind::whileRpt:whileStmt(node);break;
            case StmtKind::doRpt:doStmt(node);break;
            case StmtKind::forRpt:forStmt(node);break;
            case StmtKind::continueStmt:_continue();break;
            case StmtKind::assignStmt:assignStmt(node);break;
            case StmtKind::declareStmt:declareStmt(node);break;
            case StmtKind::readStmt:read(node);break;
            case StmtKind::breakStmt:_break();break;
        }
    }